

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelTests.cpp
# Opt level: O2

void __thiscall
ModelTestFixture_testSizeZeroWithoutSave_Test::TestBody
          (ModelTestFixture_testSizeZeroWithoutSave_Test *this)

{
  char *message;
  AssertHelper local_38;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  AssertionResult gtest_ar;
  Mock object;
  
  object.super_Model<Mock>._vptr_Model = (_func_int **)0x0;
  object.super_Model<Mock>.id = 0;
  object.super_Model<Mock>._12_4_ = 0;
  Mock::Mock(&object);
  local_30.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Model<Mock>::objectList._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_38.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"Mock::all().size()","0",(unsigned_long *)&local_30,
             (int *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ajatprabha[P]CS223_Apr18_02/tests/base_tests/ModelTests.cpp"
               ,0x1a,message);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(ModelTestFixture, testSizeZeroWithoutSave) {
    Mock object = Mock();
    ASSERT_EQ(Mock::all().size(), 0);
}